

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::rescalePartialsByPartition
          (BeagleCPUImpl<float,_1,_0> *this,float *destP,float *scaleFactors,
          float *cumulativeScaleFactors,int fillWithOnes,int partitionIndex)

{
  float *pfVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined8 uVar18;
  bool bVar19;
  byte bVar20;
  byte bVar21;
  long lVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  ushort uVar30;
  float fVar31;
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  double dVar37;
  undefined1 auVar38 [64];
  
  iVar2 = this->gPatternPartitionsStartPatterns[partitionIndex];
  lVar29 = (long)iVar2;
  iVar3 = this->gPatternPartitionsStartPatterns[(long)partitionIndex + 1];
  if (iVar2 < iVar3) {
    auVar32 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar33 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      iVar2 = this->kCategoryCount;
      fVar31 = 1.0;
      if (0 < iVar2) {
        iVar4 = this->kPartialsPaddedStateCount;
        auVar38 = ZEXT864(0) << 0x20;
        iVar25 = 0;
        iVar23 = (int)lVar29 * iVar4;
        do {
          if (0 < this->kStateCount) {
            lVar27 = 0;
            do {
              lVar22 = iVar23 + lVar27;
              lVar27 = lVar27 + 1;
              auVar17 = vmaxss_avx(ZEXT416((uint)destP[lVar22]),auVar38._0_16_);
              auVar38 = ZEXT1664(auVar17);
            } while (this->kStateCount != (int)lVar27);
          }
          iVar25 = iVar25 + 1;
          iVar23 = iVar23 + this->kPaddedPatternCount * iVar4;
        } while (iVar25 != iVar2);
        uVar18 = vcmpss_avx512f(auVar38._0_16_,ZEXT416(0),0);
        bVar19 = (bool)((byte)uVar18 & 1);
        fVar31 = (float)((uint)bVar19 * 0x3f800000 + (uint)!bVar19 * auVar38._0_4_);
        if (0 < iVar2) {
          iVar23 = this->kStateCount;
          iVar25 = this->kPaddedPatternCount;
          iVar24 = iVar4 * (int)lVar29;
          auVar38 = vpbroadcastq_avx512f();
          iVar26 = 0;
          auVar34 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar31)));
          do {
            if (0 < iVar23) {
              uVar28 = 0;
              do {
                auVar35 = vpbroadcastq_avx512f();
                auVar36 = vporq_avx512f(auVar35,auVar32);
                auVar35 = vporq_avx512f(auVar35,auVar33);
                uVar18 = vpcmpuq_avx512f(auVar35,auVar38,2);
                bVar20 = (byte)uVar18;
                uVar18 = vpcmpuq_avx512f(auVar36,auVar38,2);
                bVar21 = (byte)uVar18;
                uVar30 = CONCAT11(bVar21,bVar20);
                pfVar1 = destP + (long)iVar24 + uVar28;
                auVar35._4_4_ = (uint)((byte)(uVar30 >> 1) & 1) * (int)pfVar1[1];
                auVar35._0_4_ = (uint)(bVar20 & 1) * (int)*pfVar1;
                auVar35._8_4_ = (uint)((byte)(uVar30 >> 2) & 1) * (int)pfVar1[2];
                auVar35._12_4_ = (uint)((byte)(uVar30 >> 3) & 1) * (int)pfVar1[3];
                auVar35._16_4_ = (uint)((byte)(uVar30 >> 4) & 1) * (int)pfVar1[4];
                auVar35._20_4_ = (uint)((byte)(uVar30 >> 5) & 1) * (int)pfVar1[5];
                auVar35._24_4_ = (uint)((byte)(uVar30 >> 6) & 1) * (int)pfVar1[6];
                auVar35._28_4_ = (uint)((byte)(uVar30 >> 7) & 1) * (int)pfVar1[7];
                auVar35._32_4_ = (uint)(bVar21 & 1) * (int)pfVar1[8];
                auVar35._36_4_ = (uint)(bVar21 >> 1 & 1) * (int)pfVar1[9];
                auVar35._40_4_ = (uint)(bVar21 >> 2 & 1) * (int)pfVar1[10];
                auVar35._44_4_ = (uint)(bVar21 >> 3 & 1) * (int)pfVar1[0xb];
                auVar35._48_4_ = (uint)(bVar21 >> 4 & 1) * (int)pfVar1[0xc];
                auVar35._52_4_ = (uint)(bVar21 >> 5 & 1) * (int)pfVar1[0xd];
                auVar35._56_4_ = (uint)(bVar21 >> 6 & 1) * (int)pfVar1[0xe];
                auVar35._60_4_ = (uint)(bVar21 >> 7) * (int)pfVar1[0xf];
                auVar35 = vmulps_avx512f(auVar34,auVar35);
                pfVar1 = destP + (long)iVar24 + uVar28;
                bVar19 = (bool)((byte)(uVar30 >> 1) & 1);
                bVar5 = (bool)((byte)(uVar30 >> 2) & 1);
                bVar6 = (bool)((byte)(uVar30 >> 3) & 1);
                bVar7 = (bool)((byte)(uVar30 >> 4) & 1);
                bVar8 = (bool)((byte)(uVar30 >> 5) & 1);
                bVar9 = (bool)((byte)(uVar30 >> 6) & 1);
                bVar10 = (bool)((byte)(uVar30 >> 7) & 1);
                bVar11 = (bool)(bVar21 >> 1 & 1);
                bVar12 = (bool)(bVar21 >> 2 & 1);
                bVar13 = (bool)(bVar21 >> 3 & 1);
                bVar14 = (bool)(bVar21 >> 4 & 1);
                bVar15 = (bool)(bVar21 >> 5 & 1);
                bVar16 = (bool)(bVar21 >> 6 & 1);
                *pfVar1 = (float)((uint)(bVar20 & 1) * auVar35._0_4_ |
                                 (uint)!(bool)(bVar20 & 1) * (int)*pfVar1);
                pfVar1[1] = (float)((uint)bVar19 * auVar35._4_4_ | (uint)!bVar19 * (int)pfVar1[1]);
                pfVar1[2] = (float)((uint)bVar5 * auVar35._8_4_ | (uint)!bVar5 * (int)pfVar1[2]);
                pfVar1[3] = (float)((uint)bVar6 * auVar35._12_4_ | (uint)!bVar6 * (int)pfVar1[3]);
                pfVar1[4] = (float)((uint)bVar7 * auVar35._16_4_ | (uint)!bVar7 * (int)pfVar1[4]);
                pfVar1[5] = (float)((uint)bVar8 * auVar35._20_4_ | (uint)!bVar8 * (int)pfVar1[5]);
                pfVar1[6] = (float)((uint)bVar9 * auVar35._24_4_ | (uint)!bVar9 * (int)pfVar1[6]);
                pfVar1[7] = (float)((uint)bVar10 * auVar35._28_4_ | (uint)!bVar10 * (int)pfVar1[7]);
                pfVar1[8] = (float)((uint)(bVar21 & 1) * auVar35._32_4_ |
                                   (uint)!(bool)(bVar21 & 1) * (int)pfVar1[8]);
                pfVar1[9] = (float)((uint)bVar11 * auVar35._36_4_ | (uint)!bVar11 * (int)pfVar1[9]);
                pfVar1[10] = (float)((uint)bVar12 * auVar35._40_4_ | (uint)!bVar12 * (int)pfVar1[10]
                                    );
                pfVar1[0xb] = (float)((uint)bVar13 * auVar35._44_4_ |
                                     (uint)!bVar13 * (int)pfVar1[0xb]);
                pfVar1[0xc] = (float)((uint)bVar14 * auVar35._48_4_ |
                                     (uint)!bVar14 * (int)pfVar1[0xc]);
                pfVar1[0xd] = (float)((uint)bVar15 * auVar35._52_4_ |
                                     (uint)!bVar15 * (int)pfVar1[0xd]);
                pfVar1[0xe] = (float)((uint)bVar16 * auVar35._56_4_ |
                                     (uint)!bVar16 * (int)pfVar1[0xe]);
                pfVar1[0xf] = (float)((uint)(bVar21 >> 7) * auVar35._60_4_ |
                                     (uint)!(bool)(bVar21 >> 7) * (int)pfVar1[0xf]);
                uVar28 = uVar28 + 0x10;
              } while ((iVar23 + 0xfU & 0xfffffff0) != uVar28);
            }
            iVar26 = iVar26 + 1;
            iVar24 = iVar24 + iVar4 * iVar25;
          } while (iVar26 != iVar2);
        }
      }
      if ((this->kFlags & 0x400) == 0) {
        scaleFactors[lVar29] = fVar31;
        if (cumulativeScaleFactors != (float *)0x0) {
          dVar37 = log((double)fVar31);
          fVar31 = (float)(dVar37 + (double)cumulativeScaleFactors[lVar29]);
LAB_0013d97b:
          cumulativeScaleFactors[lVar29] = fVar31;
        }
      }
      else {
        dVar37 = log((double)fVar31);
        scaleFactors[lVar29] = (float)dVar37;
        if (cumulativeScaleFactors != (float *)0x0) {
          fVar31 = (float)dVar37 + cumulativeScaleFactors[lVar29];
          goto LAB_0013d97b;
        }
      }
      auVar32 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar33 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      lVar29 = lVar29 + 1;
    } while (lVar29 != iVar3);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::rescalePartialsByPartition(REALTYPE* destP,
                                                                   REALTYPE* scaleFactors,
                                                                   REALTYPE* cumulativeScaleFactors,
                                                                   const int fillWithOnes,
                                                                   const int partitionIndex) {

    int startPattern = gPatternPartitionsStartPatterns[partitionIndex];
    int endPattern = gPatternPartitionsStartPatterns[partitionIndex + 1];

    // TODO None of the code below has been optimized.
    for (int k = startPattern; k < endPattern; k++) {
        REALTYPE max = 0;
        const int patternOffset = k * kPartialsPaddedStateCount;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * kPartialsPaddedStateCount + patternOffset;
            for (int i = 0; i < kStateCount; i++) {
                if(destP[offset] > max)
                    max = destP[offset];
                offset++;
            }
        }

        if (max == 0)
            max = 1.0;

        REALTYPE oneOverMax = REALTYPE(1.0) / max;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * kPartialsPaddedStateCount + patternOffset;
            for (int i = 0; i < kStateCount; i++)
                destP[offset++] *= oneOverMax;
        }

        if (kFlags & BEAGLE_FLAG_SCALERS_LOG) {
            REALTYPE logMax = log(max);
            scaleFactors[k] = logMax;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += logMax;
        } else {
            scaleFactors[k] = max;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += log(max);
        }
    }
}